

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode
CreateRuntimeCore(JsRuntimeAttributes attributes,char *optTTUri,size_t optTTUriCount,bool isRecord,
                 bool isReplay,bool isDebug,UINT32 snapInterval,UINT32 snapHistoryLength,
                 TTDOpenResourceStreamCallback openResourceStream,
                 JsTTDReadBytesFromStreamCallback readBytesFromStream,
                 JsTTDWriteBytesToStreamCallback writeBytesToStream,
                 JsTTDFlushAndCloseStreamCallback flushAndCloseStream,
                 JsThreadServiceCallback threadService,JsRuntimeHandle *runtimeHandle)

{
  anon_class_24_3_fbf4cf01 fn;
  anon_class_104_13_da0db051 fn_00;
  JsrtRuntime *this;
  JsRuntimeHandle **in_stack_fffffffffffffee0;
  JsTTDFlushAndCloseStreamCallback *in_stack_ffffffffffffff30;
  ThreadContext *threadContext;
  JsErrorCode local_28;
  byte local_23;
  byte local_22;
  byte local_21;
  JsErrorCode runtimeResult;
  bool isDebug_local;
  bool isReplay_local;
  bool isRecord_local;
  size_t optTTUriCount_local;
  char *optTTUri_local;
  JsRuntimeAttributes attributes_local;
  
  local_23 = isDebug;
  local_22 = isReplay;
  local_21 = isRecord;
  _runtimeResult = optTTUriCount;
  optTTUriCount_local = (size_t)optTTUri;
  optTTUri_local._0_4_ = attributes;
  VALIDATE_ENTER_CURRENT_THREAD();
  if (runtimeHandle == (JsRuntimeHandle *)0x0) {
    optTTUri_local._4_4_ = JsErrorNullArgument;
  }
  else {
    *runtimeHandle = (JsRuntimeHandle)0x0;
    fn.threadService = (JsThreadServiceCallback *)&runtimeHandle;
    fn.attributes = (JsRuntimeAttributes *)&threadService;
    fn.runtimeHandle = in_stack_fffffffffffffee0;
    local_28 = GlobalAPIWrapper_NoRecord<CreateRuntimeCore(_JsRuntimeAttributes,char_const*,unsigned_long,bool,bool,bool,unsigned_int,unsigned_int,void*(*)(unsigned_long,char_const*,unsigned_long,char_const*,bool,bool),bool(*)(void*,unsigned_char*,unsigned_long,unsigned_long*),bool(*)(void*,unsigned_char_const*,unsigned_long,unsigned_long*),void(*)(void*,bool,bool),bool(*)(void(*)(void*),void*),void**)::__0>
                         (fn);
    optTTUri_local._4_4_ = local_28;
    if (local_28 == JsNoError) {
      if (((local_21 & 1) != 0 || (local_22 & 1) != 0) || (local_23 & 1) != 0) {
        this = JsrtRuntime::FromHandle(*runtimeHandle);
        JsrtRuntime::GetThreadContext(this);
        if (((local_21 & 1) != 0) && ((local_22 & 1) != 0)) {
          return JsErrorInvalidArgument;
        }
        if (((local_22 & 1) != 0) && (optTTUriCount_local == 0)) {
          return JsErrorInvalidArgument;
        }
        fn_00.runtimeHandle = (JsRuntimeHandle **)&snapInterval;
        fn_00.threadContext = (ThreadContext **)&runtimeHandle;
        fn_00.snapInterval = &snapHistoryLength;
        fn_00.snapHistoryLength = (UINT32 *)&local_21;
        fn_00.isRecord = (bool *)&local_22;
        fn_00.isReplay = (bool *)&local_23;
        fn_00.isDebug = (bool *)&runtimeResult;
        fn_00.optTTUriCount = &optTTUriCount_local;
        fn_00.optTTUri = (char **)&openResourceStream;
        fn_00.openResourceStream = (TTDOpenResourceStreamCallback *)&readBytesFromStream;
        fn_00.readBytesFromStream = &writeBytesToStream;
        fn_00.writeBytesToStream = (JsTTDWriteBytesToStreamCallback *)&flushAndCloseStream;
        fn_00.flushAndCloseStream = in_stack_ffffffffffffff30;
        local_28 = GlobalAPIWrapper_NoRecord<CreateRuntimeCore(_JsRuntimeAttributes,char_const*,unsigned_long,bool,bool,bool,unsigned_int,unsigned_int,void*(*)(unsigned_long,char_const*,unsigned_long,char_const*,bool,bool),bool(*)(void*,unsigned_char*,unsigned_long,unsigned_long*),bool(*)(void*,unsigned_char_const*,unsigned_long,unsigned_long*),void(*)(void*,bool,bool),bool(*)(void(*)(void*),void*),void**)::__1>
                             (fn_00);
      }
      optTTUri_local._4_4_ = local_28;
    }
  }
  return optTTUri_local._4_4_;
}

Assistant:

JsErrorCode CreateRuntimeCore(_In_ JsRuntimeAttributes attributes,
    _In_opt_ const char* optTTUri, size_t optTTUriCount, bool isRecord, bool isReplay, bool isDebug,
    _In_ UINT32 snapInterval, _In_ UINT32 snapHistoryLength,
    _In_opt_ TTDOpenResourceStreamCallback openResourceStream, _In_opt_ JsTTDReadBytesFromStreamCallback readBytesFromStream,
    _In_opt_ JsTTDWriteBytesToStreamCallback writeBytesToStream, _In_opt_ JsTTDFlushAndCloseStreamCallback flushAndCloseStream,
    _In_opt_ JsThreadServiceCallback threadService, _Out_ JsRuntimeHandle *runtimeHandle)
{
    VALIDATE_ENTER_CURRENT_THREAD();

    PARAM_NOT_NULL(runtimeHandle);
    *runtimeHandle = nullptr;

    JsErrorCode runtimeResult = GlobalAPIWrapper_NoRecord([&]() -> JsErrorCode {
        const JsRuntimeAttributes JsRuntimeAttributesAll =
            (JsRuntimeAttributes)(
            JsRuntimeAttributeDisableBackgroundWork |
            JsRuntimeAttributeAllowScriptInterrupt |
            JsRuntimeAttributeEnableIdleProcessing |
            JsRuntimeAttributeDisableEval |
            JsRuntimeAttributeDisableNativeCodeGeneration |
            JsRuntimeAttributeDisableExecutablePageAllocation |
            JsRuntimeAttributeEnableExperimentalFeatures |
            JsRuntimeAttributeDispatchSetExceptionsToDebugger |
            JsRuntimeAttributeDisableFatalOnOOM
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
            | JsRuntimeAttributeSerializeLibraryByteCode
#endif
        );

        Assert((attributes & ~JsRuntimeAttributesAll) == 0);
        if ((attributes & ~JsRuntimeAttributesAll) != 0)
        {
            return JsErrorInvalidArgument;
        }
        CreateFileMapping(INVALID_HANDLE_VALUE, nullptr, PAGE_READWRITE, 0, 0, nullptr);
        AllocationPolicyManager * policyManager = HeapNew(AllocationPolicyManager, (attributes & JsRuntimeAttributeDisableBackgroundWork) == 0);
        bool enableExperimentalFeatures = (attributes & JsRuntimeAttributeEnableExperimentalFeatures) != 0;
        ThreadContext * threadContext = HeapNew(ThreadContext, policyManager, threadService, enableExperimentalFeatures);

        if (((attributes & JsRuntimeAttributeDisableBackgroundWork) != 0)
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
            && !Js::Configuration::Global.flags.ConcurrentRuntime
#endif
            )
        {
            threadContext->OptimizeForManyInstances(true);
#if ENABLE_NATIVE_CODEGEN
            threadContext->EnableBgJit(false);
#endif
        }

        if (!threadContext->IsRentalThreadingEnabledInJSRT()
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
            || Js::Configuration::Global.flags.DisableRentalThreading
#endif
            )
        {
            threadContext->SetIsThreadBound();
        }

        if (attributes & JsRuntimeAttributeAllowScriptInterrupt)
        {
            threadContext->SetThreadContextFlag(ThreadContextFlagCanDisableExecution);
        }

        if (attributes & JsRuntimeAttributeDisableEval)
        {
            threadContext->SetThreadContextFlag(ThreadContextFlagEvalDisabled);
        }

        if (attributes & JsRuntimeAttributeDisableNativeCodeGeneration)
        {
            threadContext->SetThreadContextFlag(ThreadContextFlagNoJIT);
        }

        if (attributes & JsRuntimeAttributeDisableExecutablePageAllocation)
        {
            threadContext->SetThreadContextFlag(ThreadContextFlagNoJIT);
            threadContext->SetThreadContextFlag(ThreadContextFlagNoDynamicThunks);
        }

        if (attributes & JsRuntimeAttributeDisableFatalOnOOM)
        {
            threadContext->SetThreadContextFlag(ThreadContextFlagDisableFatalOnOOM);
        }

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        if (Js::Configuration::Global.flags.PrimeRecycler)
        {
            threadContext->EnsureRecycler()->Prime();
        }
#endif

        bool enableIdle = (attributes & JsRuntimeAttributeEnableIdleProcessing) == JsRuntimeAttributeEnableIdleProcessing;
        bool dispatchExceptions = (attributes & JsRuntimeAttributeDispatchSetExceptionsToDebugger) == JsRuntimeAttributeDispatchSetExceptionsToDebugger;

        JsrtRuntime * runtime = HeapNew(JsrtRuntime, threadContext, enableIdle, dispatchExceptions);
        threadContext->SetCurrentThreadId(ThreadContext::NoThread);
        *runtimeHandle = runtime->ToHandle();
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        runtime->SetSerializeByteCodeForLibrary((attributes & JsRuntimeAttributeSerializeLibraryByteCode) != 0);
#endif

        return JsNoError;
    });

#if ENABLE_TTD
    if(runtimeResult != JsNoError)
    {
        return runtimeResult;
    }

    if(isRecord | isReplay | isDebug)
    {
        ThreadContext* threadContext = JsrtRuntime::FromHandle(*runtimeHandle)->GetThreadContext();

        if(isRecord && isReplay)
        {
            return JsErrorInvalidArgument; //A runtime can only be in 1 mode
        }

        if(isReplay && optTTUri == nullptr)
        {
            return JsErrorInvalidArgument; //We must have a location to store data into
        }

        runtimeResult = GlobalAPIWrapper_NoRecord([&]() -> JsErrorCode {
            //Make sure the thread context recycler is allocated before we do anything else
            ThreadContextScope scope(threadContext);
            threadContext->EnsureRecycler();

            threadContext->InitTimeTravel(threadContext, *runtimeHandle, snapInterval, max<uint32>(2, snapHistoryLength));
            threadContext->InitHostFunctionsAndTTData(isRecord, isReplay, isDebug, optTTUriCount, optTTUri,
                openResourceStream, readBytesFromStream, writeBytesToStream, flushAndCloseStream,
                &CreateExternalObject_TTDCallback, &CreateJsRTContext_TTDCallback, &ReleaseJsRTContext_TTDCallback, &SetActiveJsRTContext_TTDCallback);

            return JsNoError;
        });
    }
#endif

    return runtimeResult;
}